

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

void RunMany(function<void_(int)> *fn,int count)

{
  bool bVar1;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int i;
  undefined1 local_30 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int count_local;
  function<void_(int)> *fn_local;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = count;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_30);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_30,
             (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  for (__range1._0_4_ = 0;
      (int)__range1 <
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; __range1._0_4_ = (int)__range1 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::function<void(int)>const&,int&>
              ((vector<std::thread,std::allocator<std::thread>> *)local_30,fn,(int *)&__range1);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_30);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&t);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_30);
  return;
}

Assistant:

static void RunMany(const std::function<void(int)>& fn, int count) {
    std::vector<std::thread> threads;
    threads.reserve(count);
    for (int i = 0; i < count; i++) {
      threads.emplace_back(fn, i);
    }
    for (auto& t : threads) {
      t.join();
    }
  }